

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O2

SRes LookInStream_Read(ILookInStream *stream,void *buf,size_t size)

{
  SRes SVar1;
  
  SVar1 = LookInStream_Read2(stream,buf,size,6);
  return SVar1;
}

Assistant:

SRes LookInStream_Read(ILookInStream *stream, void *buf, size_t size)
{
  return LookInStream_Read2(stream, buf, size, SZ_ERROR_INPUT_EOF);
}